

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::HMISong(HMISong *this,HMISong *original,char *filename,EMidiDevice type)

{
  int iVar1;
  undefined1 auVar2 [16];
  BYTE *pBVar3;
  ulong uVar4;
  TrackInfo *pTVar5;
  TrackInfo *pTVar6;
  TrackInfo *oldtrack;
  TrackInfo *newtrack;
  int i;
  EMidiDevice type_local;
  char *filename_local;
  HMISong *original_local;
  HMISong *this_local;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__HMISong_009f0678;
  NoteOffQueue::NoteOffQueue(&this->NoteOffs);
  this->SongLen = original->SongLen;
  pBVar3 = (BYTE *)operator_new__((long)original->SongLen);
  this->MusHeader = pBVar3;
  memcpy(this->MusHeader,original->MusHeader,(long)original->SongLen);
  this->NumTracks = original->NumTracks;
  (this->super_MIDIStreamer).Division = (original->super_MIDIStreamer).Division;
  iVar1 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar1;
  (this->super_MIDIStreamer).Tempo = iVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->NumTracks;
  uVar4 = SUB168(auVar2 * ZEXT816(0x38),0);
  if (SUB168(auVar2 * ZEXT816(0x38),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pTVar5 = (TrackInfo *)operator_new__(uVar4);
  this->Tracks = pTVar5;
  for (newtrack._0_4_ = 0; (int)newtrack < this->NumTracks; newtrack._0_4_ = (int)newtrack + 1) {
    pTVar6 = this->Tracks + (int)newtrack;
    pTVar5 = original->Tracks;
    pTVar6->TrackBegin =
         this->MusHeader + ((long)pTVar5[(int)newtrack].TrackBegin - (long)original->MusHeader);
    pTVar6->TrackP = 0;
    pTVar6->MaxTrackP = pTVar5[(int)newtrack].MaxTrackP;
  }
  return;
}

Assistant:

HMISong::HMISong(const HMISong *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	NumTracks = original->NumTracks;
	Division = original->Division;
	Tempo = InitialTempo = original->InitialTempo;
	Tracks = new TrackInfo[NumTracks];
	for (int i = 0; i < NumTracks; ++i)
	{
		TrackInfo *newtrack = &Tracks[i];
		const TrackInfo *oldtrack = &original->Tracks[i];

		newtrack->TrackBegin = MusHeader + (oldtrack->TrackBegin - original->MusHeader);
		newtrack->TrackP = 0;
		newtrack->MaxTrackP = oldtrack->MaxTrackP;
	}
}